

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbkeyboard.cpp
# Opt level: O0

xcb_keysym_t getUnshiftedXKey(xcb_keysym_t unshifted,xcb_keysym_t shifted)

{
  int in_ESI;
  uint in_EDI;
  long in_FS_OFFSET;
  xcb_keysym_t xupper;
  xcb_keysym_t xlower;
  xcb_keysym_t local_14;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI == 0) {
    local_c = 0xaaaaaaaa;
    local_10 = 0xaaaaaaaa;
    QXkbCommon::xkbcommon_XConvertCase(in_EDI,&local_c,&local_10);
    if ((local_c == local_10) || (in_EDI != local_10)) {
      local_14 = 0;
    }
    else {
      local_14 = local_c;
    }
  }
  else {
    local_14 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static xcb_keysym_t getUnshiftedXKey(xcb_keysym_t unshifted, xcb_keysym_t shifted)
{
    if (shifted != XKB_KEY_NoSymbol) // Has a shifted symbol
        return 0;

    xcb_keysym_t xlower;
    xcb_keysym_t xupper;
    QXkbCommon::xkbcommon_XConvertCase(unshifted, &xlower, &xupper);

    if (xlower != xupper          // Check if symbol is cased
        && unshifted == xupper) { // Unshifted must be upper case
        return xlower;
    }

    return 0;
}